

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.cpp
# Opt level: O3

bool __thiscall
index::equal_word(index *this,wstring *word,wstring *content,size_t begin,size_t size)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  wchar_t *local_38;
  size_t local_30;
  wchar_t local_28 [4];
  
  std::__cxx11::wstring::substr((ulong)&local_38,(ulong)content);
  __n = word->_M_string_length;
  if (__n == local_30) {
    if (__n == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = wmemcmp((word->_M_dataplus)._M_p,local_38,__n);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return bVar2;
}

Assistant:

bool index::equal_word(const std::wstring& word, const std::wstring& content, std::size_t begin, std::size_t size)
{
    return word == content.substr(begin, size);
}